

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall
VertexAttrib64Bit::LimitTest::setAttributes_c
          (LimitTest *this,attributeConfiguration *configuration,GLint n_type,GLuint vertex,
          vector<double,_std::allocator<double>_> *out_buffer_data)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  pointer pdVar4;
  GLint GVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  
  iVar1 = configuration->m_n_attributes_per_group;
  uVar2 = configuration->m_n_elements[n_type];
  iVar3 = configuration->m_vertex_length;
  GVar5 = calculateAttributeGroupOffset(this,configuration,n_type);
  iVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  iVar9 = 0;
  if (0 < iVar1) {
    iVar9 = iVar1;
  }
  uVar6 = GVar5 + iVar3 * vertex;
  uVar13 = (iVar1 + 1) * n_type + vertex * 0x10;
  for (; iVar7 != iVar9; iVar7 = iVar7 + 1) {
    pdVar4 = (out_buffer_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = uVar8;
    uVar10 = uVar13;
    uVar11 = uVar6;
    while( true ) {
      bVar14 = uVar12 == 0;
      uVar12 = uVar12 - 1;
      if (bVar14) break;
      pdVar4[uVar11] = (double)uVar10;
      uVar11 = uVar11 + 1;
      uVar10 = uVar10 + 1;
    }
    uVar6 = uVar6 + uVar2;
    uVar13 = uVar13 + 1;
  }
  return;
}

Assistant:

void LimitTest::setAttributes_c(const attributeConfiguration& configuration, GLint n_type, GLuint vertex,
								std::vector<GLdouble>& out_buffer_data) const
{
	const GLint n_attributes	= configuration.m_n_attributes_per_group;
	const GLint attribute_index = n_attributes * n_type;
	const GLint n_elements		= configuration.m_n_elements[n_type];
	GLuint		vertex_offset   = vertex * configuration.m_vertex_length;

	const GLint group_offset = calculateAttributeGroupOffset(configuration, n_type) + vertex_offset;

	/* Subsequent matrix elements should be assigned the following value:
	 (n_type + n_attribute + gl_VertexID * 16 + n_value)*/

	for (GLint attribute = 0; attribute < n_attributes; ++attribute)
	{
		const GLuint attribute_offset = n_elements * attribute + group_offset;

		for (GLint i = 0; i < n_elements; ++i)
		{
			out_buffer_data[attribute_offset + i] = n_type + attribute + attribute_index + vertex * 16 + i;
		}
	}
}